

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_align_prism(REF_GRID ref_grid,REF_DICT ref_dict_bcs)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_CELL ref_cell_01;
  REF_STATUS RVar1;
  REF_BOOL RVar2;
  uint uVar3;
  REF_INT local_bb8;
  REF_INT local_bb4;
  int local_bb0;
  REF_INT local_bac;
  REF_INT local_ba8;
  int local_ba4;
  REF_INT local_ba0;
  REF_INT local_b9c;
  int local_b98;
  REF_INT local_b94;
  REF_INT local_b90;
  int local_b8c;
  REF_INT local_b88;
  REF_INT local_b84;
  int local_b80;
  REF_INT local_b7c;
  REF_INT local_b78;
  int local_b74;
  REF_INT local_b70;
  REF_INT local_b6c;
  int local_b68;
  REF_STATUS ref_private_macro_code_rss_44;
  REF_STATUS ref_private_macro_code_rss_43;
  REF_STATUS ref_private_macro_code_rss_42;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_INT cell_node_2;
  REF_INT tet_2;
  REF_INT cell_face;
  char filename_1 [1024];
  REF_CAVITY ref_cavity_2;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_INT new_pri;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  char filename [1024];
  REF_CAVITY local_300;
  REF_CAVITY ref_cavity_1;
  uint local_2f0;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_BOOL contains;
  REF_INT pri_nodes [27];
  REF_INT tet_nodes [27];
  REF_INT local_1e0;
  int local_1dc;
  REF_INT tet_1;
  REF_INT cell_node_1;
  REF_CELL ref_tet;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_INT deg;
  REF_ADJ tri_tet;
  uint local_1b8;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_BOOL has_diag13;
  REF_BOOL has_diag02;
  REF_INT quad_1 [4];
  int local_190;
  REF_INT cell_edge_2;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_BOOL has_side_1;
  REF_INT tet1;
  REF_INT tet0;
  REF_INT face_nodes [4];
  REF_INT quad [4];
  REF_INT cell_edge_1;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_LONG ref_private_status_reib_bi;
  REF_LONG ref_private_status_reib_ai;
  REF_STATUS ref_private_macro_code_rsb;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_INT tet;
  REF_CAVITY ref_cavity;
  int local_e8;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_BOOL has_side;
  REF_INT node1;
  REF_INT node0;
  REF_INT cell_edge;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT cell_node;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT bc;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *off_node;
  REF_BOOL *active;
  REF_INT nodes [27];
  int local_34;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DICT ref_dict_bcs_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  ref_malloc_init_i = ref_node_synchronize_globals(ref_node_00);
  if (ref_malloc_init_i == 0) {
    ref_malloc_init_i_1 = ref_export_by_extension(ref_grid,"ref_layer_prism_before.tec");
    if (ref_malloc_init_i_1 == 0) {
      if (ref_node_00->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x477,"ref_layer_align_prism","malloc active of REF_BOOL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        off_node = (REF_INT *)malloc((long)ref_node_00->max << 2);
        if (off_node == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x477,"ref_layer_align_prism","malloc active of REF_BOOL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (bc = 0; bc < ref_node_00->max; bc = bc + 1) {
            off_node[bc] = 0;
          }
          if (ref_node_00->max < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x478,"ref_layer_align_prism","malloc off_node of REF_BOOL negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            _ref_private_macro_code_rss_1 = (REF_INT *)malloc((long)ref_node_00->max << 2);
            if (_ref_private_macro_code_rss_1 == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x478,"ref_layer_align_prism","malloc off_node of REF_BOOL NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rxs = 0; ref_private_macro_code_rxs < ref_node_00->max;
                  ref_private_macro_code_rxs = ref_private_macro_code_rxs + 1) {
                _ref_private_macro_code_rss_1[ref_private_macro_code_rxs] = -1;
              }
              for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->max; nodes[0x1a] = nodes[0x1a] + 1) {
                RVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],(REF_INT *)&active);
                if (RVar1 == 0) {
                  cell_node = -1;
                  ref_private_macro_code_rss_2 =
                       ref_dict_value(ref_dict_bcs,nodes[(long)ref_cell_00->node_per + -2],
                                      &cell_node);
                  if ((ref_private_macro_code_rss_2 != 0) && (ref_private_macro_code_rss_2 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x47d,"ref_layer_align_prism",(ulong)(uint)ref_private_macro_code_rss_2,
                           "bc");
                    return ref_private_macro_code_rss_2;
                  }
                  RVar2 = ref_phys_wall_distance_bc(cell_node);
                  if (RVar2 != 0) {
                    for (cell_edge = 0; cell_edge < ref_cell_00->node_per; cell_edge = cell_edge + 1
                        ) {
                      off_node[nodes[(long)cell_edge + -2]] = 1;
                    }
                  }
                }
              }
              node0 = ref_layer_prism_insert_hair
                                (ref_grid,ref_dict_bcs,off_node,_ref_private_macro_code_rss_1);
              if (node0 == 0) {
                node0 = 0;
                for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->max; nodes[0x1a] = nodes[0x1a] + 1)
                {
                  RVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],(REF_INT *)&active);
                  if ((((RVar1 == 0) && (_ref_private_macro_code_rss_1[(int)active] != -1)) &&
                      (_ref_private_macro_code_rss_1[active._4_4_] != -1)) &&
                     (_ref_private_macro_code_rss_1[nodes[0]] != -1)) {
                    for (node1 = 0; node1 < ref_cell_00->edge_per; node1 = node1 + 1) {
                      has_side = _ref_private_macro_code_rss_1
                                 [ref_cell_00->c2n
                                  [ref_cell_00->e2n[node1 << 1] +
                                   ref_cell_00->size_per * nodes[0x1a]]];
                      ref_private_macro_code_rss_3 =
                           _ref_private_macro_code_rss_1
                           [ref_cell_00->c2n
                            [ref_cell_00->e2n[node1 * 2 + 1] + ref_cell_00->size_per * nodes[0x1a]]]
                      ;
                      ref_cavity._4_4_ =
                           ref_cell_has_side(ref_grid->cell[8],has_side,ref_private_macro_code_rss_3
                                             ,&local_e8);
                      if (ref_cavity._4_4_ != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x493,"ref_layer_align_prism",(ulong)ref_cavity._4_4_,
                               "find tet side");
                        return ref_cavity._4_4_;
                      }
                      if (local_e8 == 0) {
                        uVar3 = ref_layer_seed_tet(ref_grid,has_side,ref_private_macro_code_rss_3,
                                                   &ref_private_macro_code_rss_5);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x497,"ref_layer_align_prism",(ulong)uVar3,"seed");
                          return uVar3;
                        }
                        uVar3 = ref_cavity_create((REF_CAVITY *)&ref_private_macro_code_rss_4);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x498,"ref_layer_align_prism",(ulong)uVar3,"cav create");
                          return uVar3;
                        }
                        uVar3 = ref_cavity_form_empty
                                          (_ref_private_macro_code_rss_4,ref_grid,
                                           ref_private_macro_code_rss_3);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x499,"ref_layer_align_prism",(ulong)uVar3,"empty");
                          return uVar3;
                        }
                        uVar3 = ref_cavity_add_tet(_ref_private_macro_code_rss_4,
                                                   ref_private_macro_code_rss_5);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x49a,"ref_layer_align_prism",(ulong)uVar3,"add tet");
                          return uVar3;
                        }
                        if ((ulong)_ref_private_macro_code_rss_4->state != 0) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x49c,"ref_layer_align_prism","add tet not unknown",0,
                                 (ulong)_ref_private_macro_code_rss_4->state);
                          return 1;
                        }
                        uVar3 = ref_cavity_enlarge_visible(_ref_private_macro_code_rss_4);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x4a0,"ref_layer_align_prism",(ulong)uVar3,"enlarge");
                          ref_cavity_tec(_ref_private_macro_code_rss_4,"cav-fail.tec");
                          ref_export_by_extension(ref_grid,"mesh-fail.tec");
                          return uVar3;
                        }
                        if ((ulong)_ref_private_macro_code_rss_4->state != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x4a5,"ref_layer_align_prism","prism top not visible",1,
                                 (ulong)_ref_private_macro_code_rss_4->state);
                          ref_cavity_tec(_ref_private_macro_code_rss_4,"ref_layer_prism_cavity.tec")
                          ;
                          ref_export_by_extension(ref_grid,"ref_layer_prism_mesh.tec");
                          return 1;
                        }
                        uVar3 = ref_cavity_replace(_ref_private_macro_code_rss_4);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x4a9,"ref_layer_align_prism",(ulong)uVar3,"cav replace");
                          ref_cavity_tec(_ref_private_macro_code_rss_4,"ref_layer_prism_cavity.tec")
                          ;
                          ref_export_by_extension(ref_grid,"ref_layer_prism_mesh.tec");
                          return uVar3;
                        }
                        uVar3 = ref_cavity_free(_ref_private_macro_code_rss_4);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x4aa,"ref_layer_align_prism",(ulong)uVar3,"cav free");
                          return uVar3;
                        }
                      }
                    }
                  }
                }
                for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->max; nodes[0x1a] = nodes[0x1a] + 1)
                {
                  RVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],(REF_INT *)&active);
                  if (((RVar1 == 0) && (_ref_private_macro_code_rss_1[(int)active] != -1)) &&
                     ((_ref_private_macro_code_rss_1[active._4_4_] != -1 &&
                      (_ref_private_macro_code_rss_1[nodes[0]] != -1)))) {
                    for (quad[3] = 0; quad[3] < ref_cell_00->edge_per; quad[3] = quad[3] + 1) {
                      face_nodes[2] = -1;
                      face_nodes[3] = -1;
                      quad[0] = -1;
                      quad[1] = -1;
                      uVar3 = ref_cell_has_side(ref_grid->cell[8],
                                                ref_cell_00->c2n
                                                [ref_cell_00->e2n[quad[3] << 1] +
                                                 ref_cell_00->size_per * nodes[0x1a]],
                                                _ref_private_macro_code_rss_1
                                                [ref_cell_00->c2n
                                                 [ref_cell_00->e2n[quad[3] * 2 + 1] +
                                                  ref_cell_00->size_per * nodes[0x1a]]],
                                                &ref_private_macro_code_rss_10);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x4c1,"ref_layer_align_prism",(ulong)uVar3,"diag");
                        return uVar3;
                      }
                      if (ref_private_macro_code_rss_10 != 0) {
                        face_nodes[2] =
                             ref_cell_00->c2n
                             [ref_cell_00->e2n[quad[3] << 1] + ref_cell_00->size_per * nodes[0x1a]];
                        face_nodes[3] =
                             ref_cell_00->c2n
                             [ref_cell_00->e2n[quad[3] * 2 + 1] +
                              ref_cell_00->size_per * nodes[0x1a]];
                        quad[0] = _ref_private_macro_code_rss_1
                                  [ref_cell_00->c2n
                                   [ref_cell_00->e2n[quad[3] * 2 + 1] +
                                    ref_cell_00->size_per * nodes[0x1a]]];
                        quad[1] = _ref_private_macro_code_rss_1
                                  [ref_cell_00->c2n
                                   [ref_cell_00->e2n[quad[3] << 1] +
                                    ref_cell_00->size_per * nodes[0x1a]]];
                      }
                      uVar3 = ref_cell_has_side(ref_grid->cell[8],
                                                ref_cell_00->c2n
                                                [ref_cell_00->e2n[quad[3] * 2 + 1] +
                                                 ref_cell_00->size_per * nodes[0x1a]],
                                                _ref_private_macro_code_rss_1
                                                [ref_cell_00->c2n
                                                 [ref_cell_00->e2n[quad[3] << 1] +
                                                  ref_cell_00->size_per * nodes[0x1a]]],
                                                &ref_private_macro_code_rss_10);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x4cd,"ref_layer_align_prism",(ulong)uVar3,"diag");
                        return uVar3;
                      }
                      if (ref_private_macro_code_rss_10 != 0) {
                        face_nodes[2] =
                             ref_cell_00->c2n
                             [ref_cell_00->e2n[quad[3] * 2 + 1] +
                              ref_cell_00->size_per * nodes[0x1a]];
                        face_nodes[3] =
                             ref_cell_00->c2n
                             [ref_cell_00->e2n[quad[3] << 1] + ref_cell_00->size_per * nodes[0x1a]];
                        quad[0] = _ref_private_macro_code_rss_1
                                  [ref_cell_00->c2n
                                   [ref_cell_00->e2n[quad[3] << 1] +
                                    ref_cell_00->size_per * nodes[0x1a]]];
                        quad[1] = _ref_private_macro_code_rss_1
                                  [ref_cell_00->c2n
                                   [ref_cell_00->e2n[quad[3] * 2 + 1] +
                                    ref_cell_00->size_per * nodes[0x1a]]];
                      }
                      if (face_nodes[2] == -1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x4d4,"ref_layer_align_prism","diag not found");
                        return 1;
                      }
                      tet1 = face_nodes[2];
                      tet0 = face_nodes[3];
                      face_nodes[0] = quad[0];
                      face_nodes[1] = face_nodes[2];
                      uVar3 = ref_cell_with_face(ref_grid->cell[8],&tet1,&has_side_1,
                                                 &ref_private_macro_code_rss_9);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x4db,"ref_layer_align_prism",(ulong)uVar3,"tets");
                        return uVar3;
                      }
                      if ((has_side_1 == -1) && (ref_private_macro_code_rss_9 == -1)) {
                        uVar3 = ref_layer_recover_face(ref_grid,&tet1);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x4dd,"ref_layer_align_prism",(ulong)uVar3,"recover upper");
                          return uVar3;
                        }
                        printf("lower tets %d %d\n",(ulong)(uint)has_side_1,
                               (ulong)(uint)ref_private_macro_code_rss_9);
                      }
                      tet1 = face_nodes[2];
                      tet0 = quad[0];
                      face_nodes[0] = quad[1];
                      face_nodes[1] = face_nodes[2];
                      uVar3 = ref_cell_with_face(ref_grid->cell[8],&tet1,&has_side_1,
                                                 &ref_private_macro_code_rss_9);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x4e6,"ref_layer_align_prism",(ulong)uVar3,"tets");
                        return uVar3;
                      }
                      if ((has_side_1 == -1) && (ref_private_macro_code_rss_9 == -1)) {
                        uVar3 = ref_layer_recover_face(ref_grid,&tet1);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x4e8,"ref_layer_align_prism",(ulong)uVar3,"recover upper");
                          return uVar3;
                        }
                        printf("upper tets %d %d\n",(ulong)(uint)has_side_1,
                               (ulong)(uint)ref_private_macro_code_rss_9);
                      }
                    }
                  }
                }
                for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->max; nodes[0x1a] = nodes[0x1a] + 1)
                {
                  RVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],(REF_INT *)&active);
                  if ((((RVar1 == 0) && (_ref_private_macro_code_rss_1[(int)active] != -1)) &&
                      (_ref_private_macro_code_rss_1[active._4_4_] != -1)) &&
                     (_ref_private_macro_code_rss_1[nodes[0]] != -1)) {
                    for (local_190 = 0; local_190 < ref_cell_00->edge_per; local_190 = local_190 + 1
                        ) {
                      has_diag13 = ref_cell_00->c2n
                                   [ref_cell_00->e2n[local_190 << 1] +
                                    ref_cell_00->size_per * nodes[0x1a]];
                      has_diag02 = ref_cell_00->c2n
                                   [ref_cell_00->e2n[local_190 * 2 + 1] +
                                    ref_cell_00->size_per * nodes[0x1a]];
                      quad_1[0] = _ref_private_macro_code_rss_1
                                  [ref_cell_00->c2n
                                   [ref_cell_00->e2n[local_190 * 2 + 1] +
                                    ref_cell_00->size_per * nodes[0x1a]]];
                      quad_1[1] = _ref_private_macro_code_rss_1
                                  [ref_cell_00->c2n
                                   [ref_cell_00->e2n[local_190 << 1] +
                                    ref_cell_00->size_per * nodes[0x1a]]];
                      ref_private_macro_code_rss_17 =
                           ref_cell_has_side(ref_grid->cell[8],has_diag13,quad_1[0],
                                             &ref_private_macro_code_rss_15);
                      if (ref_private_macro_code_rss_17 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x4fe,"ref_layer_align_prism",
                               (ulong)(uint)ref_private_macro_code_rss_17,"diag02");
                        return ref_private_macro_code_rss_17;
                      }
                      local_1b8 = ref_cell_has_side(ref_grid->cell[8],has_diag02,quad_1[1],
                                                    &ref_private_macro_code_rss_16);
                      if (local_1b8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x501,"ref_layer_align_prism",(ulong)local_1b8,"diag13");
                        return local_1b8;
                      }
                      if ((ref_private_macro_code_rss_15 != 0) &&
                         (ref_private_macro_code_rss_16 != 0)) {
                        printf("sliver\n");
                        tri_tet._4_4_ = ref_layer_remove_sliver(ref_grid,&has_diag13);
                        if (tri_tet._4_4_ != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x504,"ref_layer_align_prism",(ulong)tri_tet._4_4_,"remove sliver"
                                );
                          return tri_tet._4_4_;
                        }
                        tri_tet._4_4_ = 0;
                      }
                    }
                  }
                }
                ref_tet._0_4_ = ref_adj_create((REF_ADJ *)&ref_private_macro_code_rss_18);
                if ((uint)ref_tet == 0) {
                  ref_tet._0_4_ = 0;
                  for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->max;
                      nodes[0x1a] = nodes[0x1a] + 1) {
                    RVar1 = ref_cell_nodes(ref_cell_00,nodes[0x1a],(REF_INT *)&active);
                    if (((RVar1 == 0) && (_ref_private_macro_code_rss_1[(int)active] != -1)) &&
                       ((_ref_private_macro_code_rss_1[active._4_4_] != -1 &&
                        (_ref_private_macro_code_rss_1[nodes[0]] != -1)))) {
                      ref_cell_01 = ref_grid->cell[8];
                      ref_private_macro_code_rss_19 = (int)active;
                      contains = active._4_4_;
                      pri_nodes[0] = nodes[0];
                      pri_nodes[1] = _ref_private_macro_code_rss_1[(int)active];
                      pri_nodes[2] = _ref_private_macro_code_rss_1[active._4_4_];
                      pri_nodes[3] = _ref_private_macro_code_rss_1[nodes[0]];
                      if (((int)active < 0) || (ref_cell_01->ref_adj->nnode <= (int)active)) {
                        local_b68 = -1;
                      }
                      else {
                        local_b68 = ref_cell_01->ref_adj->first[(int)active];
                      }
                      local_34 = local_b68;
                      if (local_b68 == -1) {
                        local_b6c = -1;
                      }
                      else {
                        local_b6c = ref_cell_01->ref_adj->item[local_b68].ref;
                      }
                      local_1e0 = local_b6c;
                      while (local_34 != -1) {
                        for (local_1dc = 0; local_1dc < ref_cell_01->node_per;
                            local_1dc = local_1dc + 1) {
                          if (_ref_private_macro_code_rss_1[(int)active] ==
                              ref_cell_01->c2n[local_1dc + ref_cell_01->size_per * local_1e0]) {
                            ref_private_macro_code_rss_21 =
                                 ref_cell_nodes(ref_cell_01,local_1e0,pri_nodes + 0x1a);
                            if (ref_private_macro_code_rss_21 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x51e,"ref_layer_align_prism",
                                     (ulong)(uint)ref_private_macro_code_rss_21,"tet");
                              return ref_private_macro_code_rss_21;
                            }
                            ref_private_macro_code_rss_22 =
                                 ref_layer_tet_prism(&ref_private_macro_code_rss_19,pri_nodes + 0x1a
                                                     ,&ref_private_macro_code_rss_20);
                            if (ref_private_macro_code_rss_22 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x51f,"ref_layer_align_prism",
                                     (ulong)(uint)ref_private_macro_code_rss_22,"contains");
                              return ref_private_macro_code_rss_22;
                            }
                            if (ref_private_macro_code_rss_20 != 0) {
                              ref_private_macro_code_rss_23 =
                                   ref_adj_add_uniquely
                                             (_ref_private_macro_code_rss_18,nodes[0x1a],local_1e0);
                              if (ref_private_macro_code_rss_23 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                       ,0x521,"ref_layer_align_prism",
                                       (ulong)(uint)ref_private_macro_code_rss_23,"add");
                                return ref_private_macro_code_rss_23;
                              }
                              ref_private_macro_code_rss_23 = 0;
                            }
                          }
                        }
                        local_34 = ref_cell_01->ref_adj->item[local_34].next;
                        if (local_34 == -1) {
                          local_b70 = -1;
                        }
                        else {
                          local_b70 = ref_cell_01->ref_adj->item[local_34].ref;
                        }
                        local_1e0 = local_b70;
                      }
                      if ((active._4_4_ < 0) || (ref_cell_01->ref_adj->nnode <= active._4_4_)) {
                        local_b74 = -1;
                      }
                      else {
                        local_b74 = ref_cell_01->ref_adj->first[active._4_4_];
                      }
                      local_34 = local_b74;
                      if (local_b74 == -1) {
                        local_b78 = -1;
                      }
                      else {
                        local_b78 = ref_cell_01->ref_adj->item[local_b74].ref;
                      }
                      local_1e0 = local_b78;
                      while (local_34 != -1) {
                        for (local_1dc = 0; local_1dc < ref_cell_01->node_per;
                            local_1dc = local_1dc + 1) {
                          if (_ref_private_macro_code_rss_1[active._4_4_] ==
                              ref_cell_01->c2n[local_1dc + ref_cell_01->size_per * local_1e0]) {
                            ref_private_macro_code_rss_24 =
                                 ref_cell_nodes(ref_cell_01,local_1e0,pri_nodes + 0x1a);
                            if (ref_private_macro_code_rss_24 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x526,"ref_layer_align_prism",
                                     (ulong)(uint)ref_private_macro_code_rss_24,"tet");
                              return ref_private_macro_code_rss_24;
                            }
                            ref_private_macro_code_rss_25 =
                                 ref_layer_tet_prism(&ref_private_macro_code_rss_19,pri_nodes + 0x1a
                                                     ,&ref_private_macro_code_rss_20);
                            if (ref_private_macro_code_rss_25 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x527,"ref_layer_align_prism",
                                     (ulong)(uint)ref_private_macro_code_rss_25,"contains");
                              return ref_private_macro_code_rss_25;
                            }
                            if (ref_private_macro_code_rss_20 != 0) {
                              ref_private_macro_code_rss_26 =
                                   ref_adj_add_uniquely
                                             (_ref_private_macro_code_rss_18,nodes[0x1a],local_1e0);
                              if (ref_private_macro_code_rss_26 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                       ,0x529,"ref_layer_align_prism",
                                       (ulong)(uint)ref_private_macro_code_rss_26,"add");
                                return ref_private_macro_code_rss_26;
                              }
                              ref_private_macro_code_rss_26 = 0;
                            }
                          }
                        }
                        local_34 = ref_cell_01->ref_adj->item[local_34].next;
                        if (local_34 == -1) {
                          local_b7c = -1;
                        }
                        else {
                          local_b7c = ref_cell_01->ref_adj->item[local_34].ref;
                        }
                        local_1e0 = local_b7c;
                      }
                      if ((nodes[0] < 0) || (ref_cell_01->ref_adj->nnode <= nodes[0])) {
                        local_b80 = -1;
                      }
                      else {
                        local_b80 = ref_cell_01->ref_adj->first[nodes[0]];
                      }
                      local_34 = local_b80;
                      if (local_b80 == -1) {
                        local_b84 = -1;
                      }
                      else {
                        local_b84 = ref_cell_01->ref_adj->item[local_b80].ref;
                      }
                      local_1e0 = local_b84;
                      while (local_34 != -1) {
                        for (local_1dc = 0; local_1dc < ref_cell_01->node_per;
                            local_1dc = local_1dc + 1) {
                          if (_ref_private_macro_code_rss_1[nodes[0]] ==
                              ref_cell_01->c2n[local_1dc + ref_cell_01->size_per * local_1e0]) {
                            ref_private_macro_code_rss_27 =
                                 ref_cell_nodes(ref_cell_01,local_1e0,pri_nodes + 0x1a);
                            if (ref_private_macro_code_rss_27 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x52e,"ref_layer_align_prism",
                                     (ulong)(uint)ref_private_macro_code_rss_27,"tet");
                              return ref_private_macro_code_rss_27;
                            }
                            ref_private_macro_code_rss_28 =
                                 ref_layer_tet_prism(&ref_private_macro_code_rss_19,pri_nodes + 0x1a
                                                     ,&ref_private_macro_code_rss_20);
                            if (ref_private_macro_code_rss_28 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x52f,"ref_layer_align_prism",
                                     (ulong)(uint)ref_private_macro_code_rss_28,"contains");
                              return ref_private_macro_code_rss_28;
                            }
                            if (ref_private_macro_code_rss_20 != 0) {
                              local_2f0 = ref_adj_add_uniquely
                                                    (_ref_private_macro_code_rss_18,nodes[0x1a],
                                                     local_1e0);
                              if (local_2f0 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                       ,0x531,"ref_layer_align_prism",(ulong)local_2f0,"add");
                                return local_2f0;
                              }
                              local_2f0 = 0;
                            }
                          }
                        }
                        local_34 = ref_cell_01->ref_adj->item[local_34].next;
                        if (local_34 == -1) {
                          local_b88 = -1;
                        }
                        else {
                          local_b88 = ref_cell_01->ref_adj->item[local_34].ref;
                        }
                        local_1e0 = local_b88;
                      }
                      ref_cavity_1._4_4_ =
                           ref_adj_degree(_ref_private_macro_code_rss_18,nodes[0x1a],
                                          (REF_INT *)((long)&ref_tet + 4));
                      if (ref_cavity_1._4_4_ != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x535,"ref_layer_align_prism",(ulong)ref_cavity_1._4_4_,"deg");
                        return ref_cavity_1._4_4_;
                      }
                      if (ref_tet._4_4_ != 3) {
                        ref_private_macro_code_rss_31 = ref_cavity_create(&local_300);
                        if (ref_private_macro_code_rss_31 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x539,"ref_layer_align_prism",
                                 (ulong)(uint)ref_private_macro_code_rss_31,"cav create");
                          return ref_private_macro_code_rss_31;
                        }
                        ref_private_macro_code_rss_32 = ref_cavity_form_empty(local_300,ref_grid,-1)
                        ;
                        if (ref_private_macro_code_rss_32 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x53a,"ref_layer_align_prism",
                                 (ulong)(uint)ref_private_macro_code_rss_32,"empty");
                          return ref_private_macro_code_rss_32;
                        }
                        if ((nodes[0x1a] < 0) ||
                           (_ref_private_macro_code_rss_18->nnode <= nodes[0x1a])) {
                          local_b8c = -1;
                        }
                        else {
                          local_b8c = _ref_private_macro_code_rss_18->first[nodes[0x1a]];
                        }
                        local_34 = local_b8c;
                        if (local_b8c == -1) {
                          local_b90 = -1;
                        }
                        else {
                          local_b90 = _ref_private_macro_code_rss_18->item[local_b8c].ref;
                        }
                        local_1e0 = local_b90;
                        ref_private_macro_code_rss_32 = 0;
                        while (local_34 != -1) {
                          ref_private_macro_code_rss_33 = ref_cavity_add_tet(local_300,local_1e0);
                          if (ref_private_macro_code_rss_33 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x53c,"ref_layer_align_prism",
                                   (ulong)(uint)ref_private_macro_code_rss_33,"add tet");
                            return ref_private_macro_code_rss_33;
                          }
                          local_34 = _ref_private_macro_code_rss_18->item[local_34].next;
                          if (local_34 == -1) {
                            local_b94 = -1;
                          }
                          else {
                            local_b94 = _ref_private_macro_code_rss_18->item[local_34].ref;
                          }
                          local_1e0 = local_b94;
                          ref_private_macro_code_rss_33 = 0;
                        }
                        snprintf((char *)&ref_private_macro_code_rss_30,0x400,"prism-%d-cav.tec",
                                 (ulong)(uint)nodes[0x1a]);
                        printf("prism tets %d %s\n",(ulong)ref_tet._4_4_,
                               &ref_private_macro_code_rss_30);
                        new_pri = ref_cavity_tec(local_300,(char *)&ref_private_macro_code_rss_30);
                        if (new_pri != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x540,"ref_layer_align_prism",(ulong)(uint)new_pri,"cav tec");
                          return new_pri;
                        }
                        ref_private_macro_code_rss_34 = ref_cavity_free(local_300);
                        if (ref_private_macro_code_rss_34 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x541,"ref_layer_align_prism",
                                 (ulong)(uint)ref_private_macro_code_rss_34,"cav free");
                          return ref_private_macro_code_rss_34;
                        }
                        ref_private_macro_code_rss_34 = 0;
                      }
                      if (ref_tet._4_4_ == 3) {
                        if ((nodes[0x1a] < 0) ||
                           (_ref_private_macro_code_rss_18->nnode <= nodes[0x1a])) {
                          local_b98 = -1;
                        }
                        else {
                          local_b98 = _ref_private_macro_code_rss_18->first[nodes[0x1a]];
                        }
                        local_34 = local_b98;
                        if (local_b98 == -1) {
                          local_b9c = -1;
                        }
                        else {
                          local_b9c = _ref_private_macro_code_rss_18->item[local_b98].ref;
                        }
                        local_1e0 = local_b9c;
                        while (local_34 != -1) {
                          uVar3 = ref_cell_remove(ref_grid->cell[8],local_1e0);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x546,"ref_layer_align_prism",(ulong)uVar3,"rm tet");
                            return uVar3;
                          }
                          local_34 = _ref_private_macro_code_rss_18->item[local_34].next;
                          if (local_34 == -1) {
                            local_ba0 = -1;
                          }
                          else {
                            local_ba0 = _ref_private_macro_code_rss_18->item[local_34].ref;
                          }
                          local_1e0 = local_ba0;
                        }
                        uVar3 = ref_cell_add(ref_grid->cell[10],&ref_private_macro_code_rss_19,
                                             &ref_private_macro_code_rss_35);
                        if (uVar3 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x549,"ref_layer_align_prism",(ulong)uVar3,"add pri");
                          return uVar3;
                        }
                      }
                    }
                  }
                  ref_grid_local._4_4_ = ref_adj_free(_ref_private_macro_code_rss_18);
                  if (ref_grid_local._4_4_ == 0) {
                    for (nodes[0x1a] = 0; nodes[0x1a] < ref_grid->cell[10]->max;
                        nodes[0x1a] = nodes[0x1a] + 1) {
                      RVar1 = ref_cell_nodes(ref_grid->cell[10],nodes[0x1a],(REF_INT *)&active);
                      if (RVar1 == 0) {
                        for (cell_node_2 = 0; cell_node_2 < ref_grid->cell[10]->face_per;
                            cell_node_2 = cell_node_2 + 1) {
                          uVar3 = ref_cavity_create((REF_CAVITY *)(filename_1 + 0x3f8));
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x555,"ref_layer_align_prism",(ulong)uVar3,"cav create");
                            return uVar3;
                          }
                          uVar3 = ref_cavity_form_empty((REF_CAVITY)filename_1._1016_8_,ref_grid,-1)
                          ;
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x556,"ref_layer_align_prism",(ulong)uVar3,"empty");
                            return uVar3;
                          }
                          if (ref_grid->cell[10]->c2n
                              [ref_grid->cell[10]->f2n[cell_node_2 << 2] +
                               ref_grid->cell[10]->size_per * nodes[0x1a]] !=
                              ref_grid->cell[10]->c2n
                              [ref_grid->cell[10]->f2n[cell_node_2 * 4 + 3] +
                               ref_grid->cell[10]->size_per * nodes[0x1a]]) {
                            if ((ref_grid->cell[10]->c2n
                                 [ref_grid->cell[10]->f2n[cell_node_2 << 2] +
                                  ref_grid->cell[10]->size_per * nodes[0x1a]] < 0) ||
                               (ref_grid->cell[8]->ref_adj->nnode <=
                                ref_grid->cell[10]->c2n
                                [ref_grid->cell[10]->f2n[cell_node_2 << 2] +
                                 ref_grid->cell[10]->size_per * nodes[0x1a]])) {
                              local_ba4 = -1;
                            }
                            else {
                              local_ba4 = ref_grid->cell[8]->ref_adj->first
                                          [ref_grid->cell[10]->c2n
                                           [ref_grid->cell[10]->f2n[cell_node_2 << 2] +
                                            ref_grid->cell[10]->size_per * nodes[0x1a]]];
                            }
                            local_34 = local_ba4;
                            if (local_ba4 == -1) {
                              local_ba8 = -1;
                            }
                            else {
                              local_ba8 = ref_grid->cell[8]->ref_adj->item[local_ba4].ref;
                            }
                            ref_private_macro_code_rss_37 = local_ba8;
                            while (local_34 != -1) {
                              for (ref_private_macro_code_rss_38 = 0;
                                  ref_private_macro_code_rss_38 < ref_grid->cell[8]->node_per;
                                  ref_private_macro_code_rss_38 = ref_private_macro_code_rss_38 + 1)
                              {
                                if ((ref_grid->cell[10]->c2n
                                     [ref_grid->cell[10]->f2n[cell_node_2 * 4 + 2] +
                                      ref_grid->cell[10]->size_per * nodes[0x1a]] ==
                                     ref_grid->cell[8]->c2n
                                     [ref_private_macro_code_rss_38 +
                                      ref_grid->cell[8]->size_per * ref_private_macro_code_rss_37])
                                   && (uVar3 = ref_cavity_add_tet((REF_CAVITY)filename_1._1016_8_,
                                                                  ref_private_macro_code_rss_37),
                                      uVar3 != 0)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x55e,"ref_layer_align_prism",(ulong)uVar3,"add tet");
                                  return uVar3;
                                }
                              }
                              local_34 = ref_grid->cell[8]->ref_adj->item[local_34].next;
                              if (local_34 == -1) {
                                local_bac = -1;
                              }
                              else {
                                local_bac = ref_grid->cell[8]->ref_adj->item[local_34].ref;
                              }
                              ref_private_macro_code_rss_37 = local_bac;
                            }
                            if ((ref_grid->cell[10]->c2n
                                 [ref_grid->cell[10]->f2n[cell_node_2 * 4 + 1] +
                                  ref_grid->cell[10]->size_per * nodes[0x1a]] < 0) ||
                               (ref_grid->cell[8]->ref_adj->nnode <=
                                ref_grid->cell[10]->c2n
                                [ref_grid->cell[10]->f2n[cell_node_2 * 4 + 1] +
                                 ref_grid->cell[10]->size_per * nodes[0x1a]])) {
                              local_bb0 = -1;
                            }
                            else {
                              local_bb0 = ref_grid->cell[8]->ref_adj->first
                                          [ref_grid->cell[10]->c2n
                                           [ref_grid->cell[10]->f2n[cell_node_2 * 4 + 1] +
                                            ref_grid->cell[10]->size_per * nodes[0x1a]]];
                            }
                            local_34 = local_bb0;
                            if (local_bb0 == -1) {
                              local_bb4 = -1;
                            }
                            else {
                              local_bb4 = ref_grid->cell[8]->ref_adj->item[local_bb0].ref;
                            }
                            ref_private_macro_code_rss_37 = local_bb4;
                            while (local_34 != -1) {
                              for (ref_private_macro_code_rss_38 = 0;
                                  ref_private_macro_code_rss_38 < ref_grid->cell[8]->node_per;
                                  ref_private_macro_code_rss_38 = ref_private_macro_code_rss_38 + 1)
                              {
                                if ((ref_grid->cell[10]->c2n
                                     [ref_grid->cell[10]->f2n[cell_node_2 * 4 + 3] +
                                      ref_grid->cell[10]->size_per * nodes[0x1a]] ==
                                     ref_grid->cell[8]->c2n
                                     [ref_private_macro_code_rss_38 +
                                      ref_grid->cell[8]->size_per * ref_private_macro_code_rss_37])
                                   && (uVar3 = ref_cavity_add_tet((REF_CAVITY)filename_1._1016_8_,
                                                                  ref_private_macro_code_rss_37),
                                      uVar3 != 0)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x565,"ref_layer_align_prism",(ulong)uVar3,"add tet");
                                  return uVar3;
                                }
                              }
                              local_34 = ref_grid->cell[8]->ref_adj->item[local_34].next;
                              if (local_34 == -1) {
                                local_bb8 = -1;
                              }
                              else {
                                local_bb8 = ref_grid->cell[8]->ref_adj->item[local_34].ref;
                              }
                              ref_private_macro_code_rss_37 = local_bb8;
                            }
                          }
                          if ((**(int **)(filename_1._1016_8_ + 0x50) != 2) &&
                             (**(int **)(filename_1._1016_8_ + 0x50) != 0)) {
                            snprintf((char *)&tet_2,0x400,"glue-%d-%d-cav.tec",
                                     (ulong)(uint)nodes[0x1a],(ulong)(uint)cell_node_2);
                            printf("pyramid tets missing %d %s\n",
                                   (ulong)**(uint **)(filename_1._1016_8_ + 0x50),&tet_2);
                            if ((0 < *(int *)(filename_1._1016_8_ + 0x30)) &&
                               (uVar3 = ref_cavity_tec((REF_CAVITY)filename_1._1016_8_,
                                                       (char *)&tet_2), uVar3 != 0)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x56e,"ref_layer_align_prism",(ulong)uVar3,"cav tec");
                              return uVar3;
                            }
                          }
                          if ((**(int **)(filename_1._1016_8_ + 0x50) == 2) &&
                             (uVar3 = ref_layer_tet_to_pyr
                                                (ref_grid,nodes[0x1a],
                                                 **(REF_INT **)
                                                   (*(long *)(filename_1._1016_8_ + 0x50) + 8),
                                                 *(REF_INT *)
                                                  (*(long *)(*(long *)(filename_1._1016_8_ + 0x50) +
                                                            8) + 4)), uVar3 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x576,"ref_layer_align_prism",(ulong)uVar3,"tet2pyr");
                            return uVar3;
                          }
                          uVar3 = ref_cavity_free((REF_CAVITY)filename_1._1016_8_);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x578,"ref_layer_align_prism",(ulong)uVar3,"cav free");
                            return uVar3;
                          }
                        }
                      }
                    }
                    ref_grid_local._4_4_ =
                         ref_export_by_extension(ref_grid,"ref_layer_prism_after.tec");
                    if (ref_grid_local._4_4_ == 0) {
                      if (_ref_private_macro_code_rss_1 != (REF_INT *)0x0) {
                        free(_ref_private_macro_code_rss_1);
                      }
                      if (off_node != (REF_INT *)0x0) {
                        free(off_node);
                      }
                      ref_grid_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x57d,"ref_layer_align_prism",(ulong)ref_grid_local._4_4_,
                             "dump surf after");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x54d,"ref_layer_align_prism",(ulong)ref_grid_local._4_4_,"free");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x50e,"ref_layer_align_prism",(ulong)(uint)ref_tet,"tet list");
                  ref_grid_local._4_4_ = (uint)ref_tet;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x487,"ref_layer_align_prism",(ulong)(uint)node0,"insert hair");
                ref_grid_local._4_4_ = node0;
              }
            }
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x475
             ,"ref_layer_align_prism",(ulong)(uint)ref_malloc_init_i_1,"dump surf");
      ref_grid_local._4_4_ = ref_malloc_init_i_1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x472,
           "ref_layer_align_prism",(ulong)(uint)ref_malloc_init_i,"sync glob");
    ref_grid_local._4_4_ = ref_malloc_init_i;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_layer_align_prism(REF_GRID ref_grid,
                                         REF_DICT ref_dict_bcs) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL *active;
  REF_INT *off_node;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_export_by_extension(ref_grid, "ref_layer_prism_before.tec"),
      "dump surf");

  ref_malloc_init(active, ref_node_max(ref_node), REF_BOOL, REF_FALSE);
  ref_malloc_init(off_node, ref_node_max(ref_node), REF_BOOL, REF_EMPTY);
  /* mark active nodes */
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_INT bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      REF_INT cell_node;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        active[nodes[cell_node]] = REF_TRUE;
      }
    }
  }

  RSS(ref_layer_prism_insert_hair(ref_grid, ref_dict_bcs, active, off_node),
      "insert hair");

  /* recover tet slides of prism tops, extend for boundary */
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
        REF_EMPTY != off_node[nodes[2]]) {
      REF_INT cell_edge;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        REF_INT node0 = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
        REF_INT node1 = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
        REF_BOOL has_side;
        RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &has_side),
            "find tet side");
        if (!has_side) {
          REF_CAVITY ref_cavity;
          REF_INT tet;
          RSS(ref_layer_seed_tet(ref_grid, node0, node1, &tet), "seed");
          RSS(ref_cavity_create(&ref_cavity), "cav create");
          RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node1), "empty");
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
          REIS(REF_CAVITY_UNKNOWN, ref_cavity_state(ref_cavity),
               "add tet not unknown");
          RSB(ref_cavity_enlarge_visible(ref_cavity), "enlarge", {
            ref_cavity_tec(ref_cavity, "cav-fail.tec");
            ref_export_by_extension(ref_grid, "mesh-fail.tec");
          });
          REIB(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
               "prism top not visible", {
                 ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
                 ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
               });
          RSB(ref_cavity_replace(ref_cavity), "cav replace", {
            ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
            ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
          });
          RSS(ref_cavity_free(ref_cavity), "cav free");
        }
      }
    }
  }
  /* recover prism sides */
  {
    REF_INT cell_edge;
    REF_INT quad[4], face_nodes[4], tet0, tet1;
    REF_BOOL has_side;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          quad[0] = REF_EMPTY;
          quad[1] = REF_EMPTY;
          quad[2] = REF_EMPTY;
          quad[3] = REF_EMPTY;
          RSS(ref_cell_has_side(
                  ref_grid_tet(ref_grid),
                  ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                  off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)],
                  &has_side),
              "diag");
          if (has_side) {
            quad[0] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
            quad[1] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
            quad[2] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
            quad[3] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
          }
          RSS(ref_cell_has_side(
                  ref_grid_tet(ref_grid),
                  ref_cell_e2n(ref_cell, 1, cell_edge, cell),
                  off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)],
                  &has_side),
              "diag");
          if (has_side) {
            quad[0] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
            quad[1] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
            quad[2] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
            quad[3] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
          }
          RUS(REF_EMPTY, quad[0], "diag not found");
          face_nodes[0] = quad[0];
          face_nodes[1] = quad[1];
          face_nodes[2] = quad[2];
          face_nodes[3] = face_nodes[0];
          RSS(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0,
                                 &tet1),
              "tets");
          if (tet0 == REF_EMPTY && tet1 == REF_EMPTY) {
            RSS(ref_layer_recover_face(ref_grid, face_nodes), "recover upper");
            printf("lower tets %d %d\n", tet0, tet1);
          }
          face_nodes[0] = quad[0];
          face_nodes[1] = quad[2];
          face_nodes[2] = quad[3];
          face_nodes[3] = face_nodes[0];
          RSS(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0,
                                 &tet1),
              "tets");
          if (tet0 == REF_EMPTY && tet1 == REF_EMPTY) {
            RSS(ref_layer_recover_face(ref_grid, face_nodes), "recover upper");
            printf("upper tets %d %d\n", tet0, tet1);
          }
        }
      }
    }
  }
  /* remove quad slivers */
  {
    REF_INT cell_edge;
    REF_INT quad[4];
    REF_BOOL has_diag02, has_diag13;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          quad[0] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
          quad[1] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
          quad[2] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
          quad[3] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
          RSS(ref_cell_has_side(ref_grid_tet(ref_grid), quad[0], quad[2],
                                &has_diag02),
              "diag02");
          RSS(ref_cell_has_side(ref_grid_tet(ref_grid), quad[1], quad[3],
                                &has_diag13),
              "diag13");
          if (has_diag02 && has_diag13) {
            printf("sliver\n");
            RSS(ref_layer_remove_sliver(ref_grid, quad), "remove sliver");
          }
        }
      }
    }
  }
  /* replace tets with prism */
  {
    REF_ADJ tri_tet;
    REF_INT deg;
    RSS(ref_adj_create(&tri_tet), "tet list");
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        REF_CELL ref_tet = ref_grid_tet(ref_grid);
        REF_INT cell_node, tet, tet_nodes[REF_CELL_MAX_SIZE_PER],
            pri_nodes[REF_CELL_MAX_SIZE_PER];
        REF_BOOL contains;
        pri_nodes[0] = nodes[0];
        pri_nodes[1] = nodes[1];
        pri_nodes[2] = nodes[2];
        pri_nodes[3] = off_node[nodes[0]];
        pri_nodes[4] = off_node[nodes[1]];
        pri_nodes[5] = off_node[nodes[2]];
        each_ref_cell_having_node2(ref_tet, nodes[0], off_node[nodes[0]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }
        each_ref_cell_having_node2(ref_tet, nodes[1], off_node[nodes[1]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }
        each_ref_cell_having_node2(ref_tet, nodes[2], off_node[nodes[2]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }

        RSS(ref_adj_degree(tri_tet, cell, &deg), "deg");
        if (3 != deg) {
          REF_CAVITY ref_cavity;
          char filename[1024];
          RSS(ref_cavity_create(&ref_cavity), "cav create");
          RSS(ref_cavity_form_empty(ref_cavity, ref_grid, REF_EMPTY), "empty");
          each_ref_adj_node_item_with_ref(tri_tet, cell, item, tet) {
            RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
          }
          snprintf(filename, 1024, "prism-%d-cav.tec", cell);
          printf("prism tets %d %s\n", deg, filename);
          RSS(ref_cavity_tec(ref_cavity, filename), "cav tec");
          RSS(ref_cavity_free(ref_cavity), "cav free");
        }
        if (3 == deg) {
          REF_INT new_pri;
          each_ref_adj_node_item_with_ref(tri_tet, cell, item, tet) {
            RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet), "rm tet");
          }
          RSS(ref_cell_add(ref_grid_pri(ref_grid), pri_nodes, &new_pri),
              "add pri");
        }
      }
    }
    RSS(ref_adj_free(tri_tet), "free");
  }
  /* replace two tets with pyramid */
  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    REF_CAVITY ref_cavity;
    char filename[1024];
    REF_INT cell_face, tet, cell_node;
    each_ref_cell_cell_face(ref_grid_pri(ref_grid), cell_face) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      RSS(ref_cavity_form_empty(ref_cavity, ref_grid, REF_EMPTY), "empty");
      if (ref_cell_f2n(ref_grid_pri(ref_grid), 0, cell_face, cell) !=
          ref_cell_f2n(ref_grid_pri(ref_grid), 3, cell_face, cell)) {
        each_ref_cell_having_node2(
            ref_grid_tet(ref_grid),
            ref_cell_f2n(ref_grid_pri(ref_grid), 0, cell_face, cell),
            ref_cell_f2n(ref_grid_pri(ref_grid), 2, cell_face, cell), item,
            cell_node, tet) {
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
        }
        each_ref_cell_having_node2(
            ref_grid_tet(ref_grid),
            ref_cell_f2n(ref_grid_pri(ref_grid), 1, cell_face, cell),
            ref_cell_f2n(ref_grid_pri(ref_grid), 3, cell_face, cell), item,
            cell_node, tet) {
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
        }
      }
      if (2 != ref_list_n(ref_cavity_tet_list(ref_cavity)) &&
          0 != ref_list_n(ref_cavity_tet_list(ref_cavity))) {
        snprintf(filename, 1024, "glue-%d-%d-cav.tec", cell, cell_face);
        printf("pyramid tets missing %d %s\n",
               ref_list_n(ref_cavity_tet_list(ref_cavity)), filename);
        if (0 < ref_cavity_nface(ref_cavity))
          RSS(ref_cavity_tec(ref_cavity, filename), "cav tec");
      }
      if (2 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
        /* replace two tets with pyramid */
        RSS(ref_layer_tet_to_pyr(
                ref_grid, cell,
                ref_list_value(ref_cavity_tet_list(ref_cavity), 0),
                ref_list_value(ref_cavity_tet_list(ref_cavity), 1)),
            "tet2pyr");
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
    }
  }

  RSS(ref_export_by_extension(ref_grid, "ref_layer_prism_after.tec"),
      "dump surf after");
  ref_free(off_node);
  ref_free(active);

  return REF_SUCCESS;
}